

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValueToString
          (Printer *this,Message *message,FieldDescriptor *field,int index,string *output)

{
  LogMessage *pLVar1;
  Reflection *reflection;
  TextGenerator generator;
  StringOutputStream output_stream;
  undefined1 local_80 [24];
  int local_68;
  undefined2 local_64;
  bool local_62;
  int local_60;
  int local_5c;
  FieldDescriptor *local_48;
  StringOutputStream local_40;
  
  local_48 = field;
  if (output == (string *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x8a7);
    pLVar1 = internal::LogMessage::operator<<((LogMessage *)local_80,"CHECK failed: output: ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,"output specified is nullptr");
    internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar1);
    internal::LogMessage::~LogMessage((LogMessage *)local_80);
  }
  output->_M_string_length = 0;
  *(output->_M_dataplus)._M_p = '\0';
  io::StringOutputStream::StringOutputStream(&local_40,output);
  local_60 = this->initial_indent_level_;
  local_80._0_8_ = &PTR__TextGenerator_004d7900;
  local_80._16_8_ = (char *)0x0;
  local_68 = 0;
  local_64._0_1_ = true;
  local_64._1_1_ = false;
  local_62 = false;
  local_80._8_8_ = &local_40;
  local_5c = local_60;
  (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  PrintFieldValue(this,message,reflection,local_48,index,(TextGenerator *)local_80);
  local_80._0_8_ = &PTR__TextGenerator_004d7900;
  if ((local_64._1_1_ == false) && (0 < local_68)) {
    (*((ZeroCopyOutputStream *)local_80._8_8_)->_vptr_ZeroCopyOutputStream[3])();
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValueToString(const Message& message,
                                                  const FieldDescriptor* field,
                                                  int index,
                                                  std::string* output) const {
  GOOGLE_DCHECK(output) << "output specified is nullptr";

  output->clear();
  io::StringOutputStream output_stream(output);
  TextGenerator generator(&output_stream, initial_indent_level_);

  PrintFieldValue(message, message.GetReflection(), field, index, &generator);
}